

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O0

tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
__thiscall baryonyx::sparse_matrix<int>::column(sparse_matrix<int> *this,int col)

{
  bool bVar1;
  iterator pcVar2;
  int *piVar3;
  size_type in_EDX;
  undefined4 in_register_00000034;
  sparse_matrix<int> *this_00;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> tVar4;
  col_iterator end;
  col_iterator begin;
  sparse_matrix<int> *psStack_18;
  int col_local;
  sparse_matrix<int> *this_local;
  
  this_00 = (sparse_matrix<int> *)CONCAT44(in_register_00000034,col);
  begin._4_4_ = in_EDX;
  psStack_18 = this_00;
  this_local = this;
  bVar1 = m_is_valid_index(this_00,0,in_EDX);
  if (!bVar1) {
    details::fail_fast("Precondition","m_is_valid_index(0, col)",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/sparse-matrix.hpp"
                       ,"200");
  }
  pcVar2 = fixed_array<baryonyx::sparse_matrix<int>::col_value>::begin(&this_00->m_cols_values);
  piVar3 = fixed_array<int>::operator[](&this_00->m_cols_access,begin._4_4_);
  end = pcVar2 + *piVar3;
  fixed_array<baryonyx::sparse_matrix<int>::col_value>::begin(&this_00->m_cols_values);
  fixed_array<int>::operator[](&this_00->m_cols_access,begin._4_4_ + 1);
  tVar4 = std::
          make_tuple<baryonyx::sparse_matrix<int>::col_value*&,baryonyx::sparse_matrix<int>::col_value*&>
                    ((col_value **)this,&end);
  tVar4.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
  .super__Tuple_impl<1UL,_baryonyx::sparse_matrix<int>::col_value_*>.
  super__Head_base<1UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
       (_Head_base<1UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>)
       (_Head_base<1UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>)this;
  return (tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
          )tVar4.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*>
  ;
}

Assistant:

std::tuple<col_iterator, col_iterator> column(int col) noexcept
    {
        bx_expects(m_is_valid_index(0, col));

        col_iterator begin = m_cols_values.begin() + m_cols_access[col];
        col_iterator end = m_cols_values.begin() + m_cols_access[col + 1];

        return std::make_tuple(begin, end);
    }